

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O3

bool __thiscall
draco::SequentialAttributeDecodersController::TransformAttributesToOriginalFormat
          (SequentialAttributeDecodersController *this)

{
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var1;
  PointAttribute *pPVar2;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  bool bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  PointAttribute *pPVar7;
  undefined4 extraout_var_00;
  long lVar8;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *pvVar9;
  ulong uVar10;
  bool bVar11;
  Type local_74;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *local_70;
  PointAttribute *local_68;
  long local_60;
  ulong local_58;
  string local_50;
  
  uVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[6])();
  if ((int)uVar5 < 1) {
    bVar11 = true;
  }
  else {
    pvVar9 = &this->point_ids_;
    local_58 = (ulong)uVar5;
    local_60 = -local_58;
    uVar10 = 1;
    bVar11 = false;
    local_70 = pvVar9;
    do {
      iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[7])(this);
      if (*(long *)(CONCAT44(extraout_var,iVar6) + 0x50) == 0) {
LAB_0015cdd9:
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (this->sequential_decoders_).
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        cVar4 = (**(code **)(*(long *)_Var1._M_t.
                                      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                      .
                                      super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                      ._M_head_impl + 0x30))
                          (_Var1._M_t.
                           super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                           _M_head_impl,pvVar9);
        if (cVar4 == '\0') {
          return bVar11;
        }
      }
      else {
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (this->sequential_decoders_).
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        pPVar2 = *(PointAttribute **)
                  ((long)_Var1._M_t.
                         super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                         .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                         _M_head_impl + 0x10);
        pPVar7 = SequentialAttributeDecoder::GetPortableAttribute
                           ((SequentialAttributeDecoder *)
                            _Var1._M_t.
                            super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                            .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                            _M_head_impl);
        if (pPVar7 == (PointAttribute *)0x0) goto LAB_0015cdd9;
        local_68 = pPVar7;
        iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[7])(this);
        this_00 = *(DracoOptions<draco::GeometryAttribute::Type> **)
                   (CONCAT44(extraout_var_00,iVar6) + 0x50);
        local_74 = (pPVar2->super_GeometryAttribute).attribute_type_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"skip_attribute_transform","");
        bVar3 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                          (this_00,&local_74,&local_50,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pvVar9 = local_70;
        if (!bVar3) goto LAB_0015cdd9;
        PointAttribute::CopyFrom
                  (*(PointAttribute **)
                    ((long)(this->sequential_decoders_).
                           super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1]._M_t.
                           super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           ._M_t + 0x10),local_68);
      }
      bVar11 = local_58 <= uVar10;
      lVar8 = local_60 + uVar10;
      uVar10 = uVar10 + 1;
    } while (lVar8 != 0);
  }
  return bVar11;
}

Assistant:

bool SequentialAttributeDecodersController::
    TransformAttributesToOriginalFormat() {
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    // Check whether the attribute transform should be skipped.
    if (GetDecoder()->options()) {
      const PointAttribute *const attribute =
          sequential_decoders_[i]->attribute();
      const PointAttribute *const portable_attribute =
          sequential_decoders_[i]->GetPortableAttribute();
      if (portable_attribute &&
          GetDecoder()->options()->GetAttributeBool(
              attribute->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        sequential_decoders_[i]->attribute()->CopyFrom(*portable_attribute);
        continue;
      }
    }
    if (!sequential_decoders_[i]->TransformAttributeToOriginalFormat(
            point_ids_)) {
      return false;
    }
  }
  return true;
}